

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariationalBayesEstimatorOnLDA.cpp
# Opt level: O3

double __thiscall
VariationalBayesEstimatorOnLDA::calculateVariationalLowerBound(VariationalBayesEstimatorOnLDA *this)

{
  double __x;
  uint uVar1;
  longdouble lVar2;
  longdouble lVar3;
  longdouble lVar4;
  lanczos17m64 *plVar5;
  lanczos17m64 *in_RCX;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *pvVar6;
  pointer pvVar7;
  pointer puVar8;
  int *in_R8;
  ulong uVar9;
  lanczos17m64 *plVar10;
  lanczos17m64 *plVar11;
  ulong uVar12;
  lanczos17m64 *plVar13;
  longdouble in_ST0;
  longdouble lVar14;
  longdouble lVar15;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble lVar16;
  longdouble lVar17;
  double dVar18;
  detail local_da;
  undefined1 local_d9;
  longdouble local_d8;
  detail local_ca;
  undefined1 local_c9;
  longdouble local_c8;
  detail local_be;
  undefined1 local_bd [2];
  undefined1 local_bb [2];
  undefined1 local_b9;
  double local_b8;
  double local_b0;
  longdouble local_a8;
  lanczos17m64 *local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  local_b0 = 0.0;
  if (this->_K == 0) {
    plVar5 = (lanczos17m64 *)0x0;
    local_b8 = 0.0;
  }
  else {
    local_b8 = 0.0;
    plVar10 = (lanczos17m64 *)0x0;
    local_c8 = (longdouble)1.79769313486232e+308;
    do {
      boost::math::detail::
      lgamma_imp<long_double,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>,boost::math::lanczos::lanczos17m64>
                ((longdouble *)&local_d9,&local_da,(longdouble)this->_betaSum,
                 (policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                  *)0x0,in_RCX,in_R8);
      lVar14 = in_ST5;
      if (local_c8 < ABS(in_ST0)) {
        local_d8 = in_ST0;
        boost::math::policies::detail::raise_error<std::overflow_error,double>
                  ("boost::math::lgamma<%1%>(%1%)","numeric overflow");
        in_ST0 = local_d8;
      }
      local_38 = (double)in_ST0;
      local_d8 = (longdouble)CONCAT28(local_d8._8_2_,local_38);
      local_40 = (this->_nk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[(long)plVar10] + this->_betaSum;
      boost::math::detail::
      lgamma_imp<long_double,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>,boost::math::lanczos::lanczos17m64>
                ((longdouble *)&local_d9,&local_da,(longdouble)local_40,
                 (policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                  *)0x0,in_RCX,in_R8);
      lVar15 = in_ST1;
      in_ST0 = in_ST2;
      lVar2 = in_ST3;
      lVar3 = in_ST4;
      lVar4 = in_ST5;
      lVar16 = lVar14;
      lVar17 = lVar14;
      if (local_c8 < ABS(in_ST1)) {
        local_a8 = in_ST1;
        boost::math::policies::detail::raise_error<std::overflow_error,double>
                  ("boost::math::lgamma<%1%>(%1%)","numeric overflow");
        lVar15 = local_a8;
        in_ST0 = in_ST2;
        lVar2 = in_ST3;
        lVar3 = in_ST4;
        lVar4 = in_ST5;
      }
      in_ST5 = lVar16;
      in_ST4 = lVar14;
      in_ST3 = lVar4;
      in_ST2 = lVar3;
      in_ST1 = lVar2;
      local_48 = (double)lVar15;
      local_b8 = local_b8 + (local_d8._0_8_ - local_48);
      local_98 = plVar10;
      if (this->_V != 0) {
        uVar12 = 0;
        lVar14 = in_ST1;
        lVar15 = in_ST3;
        do {
          in_ST3 = in_ST5;
          in_ST1 = lVar15;
          in_RCX = *(lanczos17m64 **)
                    &(this->_nkv).
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[(long)plVar10].
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data;
          local_50 = *(double *)(in_RCX + uVar12 * 8) +
                     (this->_beta).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar12];
          boost::math::detail::
          lgamma_imp<long_double,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>,boost::math::lanczos::lanczos17m64>
                    ((longdouble *)local_bd,&local_be,(longdouble)local_50,
                     (policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                      *)0x0,in_RCX,in_R8);
          lVar15 = in_ST2;
          lVar2 = in_ST4;
          in_ST5 = lVar17;
          local_d8 = in_ST0;
          if (local_c8 < ABS(in_ST0)) {
            boost::math::policies::detail::raise_error<std::overflow_error,double>
                      ("boost::math::lgamma<%1%>(%1%)","numeric overflow");
            lVar15 = in_ST2;
            lVar2 = in_ST4;
          }
          in_ST4 = lVar17;
          in_ST2 = lVar2;
          in_ST0 = lVar15;
          local_58 = (double)local_d8;
          local_a8 = (longdouble)CONCAT28(local_a8._8_2_,local_58);
          boost::math::detail::
          lgamma_imp<long_double,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>,boost::math::lanczos::lanczos17m64>
                    ((longdouble *)local_bb,(detail *)(local_bd + 1),
                     (longdouble)
                     (this->_beta).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar12],
                     (policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                      *)0x0,in_RCX,in_R8);
          lVar17 = in_ST5;
          local_d8 = lVar14;
          if (local_c8 < ABS(lVar14)) {
            boost::math::policies::detail::raise_error<std::overflow_error,double>
                      ("boost::math::lgamma<%1%>(%1%)","numeric overflow");
          }
          local_60 = (double)local_d8;
          local_b8 = local_b8 + (local_a8._0_8_ - local_60);
          uVar12 = uVar12 + 1;
          lVar14 = in_ST1;
          lVar15 = in_ST3;
        } while (uVar12 < this->_V);
      }
      plVar10 = local_98 + 1;
      plVar5 = (lanczos17m64 *)(ulong)this->_K;
    } while (plVar10 < plVar5);
  }
  if (this->_D != 0) {
    local_b0 = 0.0;
    plVar10 = (lanczos17m64 *)0x0;
    local_c8 = (longdouble)1.79769313486232e+308;
    do {
      boost::math::detail::
      lgamma_imp<long_double,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>,boost::math::lanczos::lanczos17m64>
                ((longdouble *)&local_c9,&local_ca,(longdouble)this->_alphaSum,
                 (policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                  *)0x0,in_RCX,in_R8);
      lVar14 = in_ST5;
      if (local_c8 < ABS(in_ST0)) {
        local_d8 = in_ST0;
        boost::math::policies::detail::raise_error<std::overflow_error,double>
                  ("boost::math::lgamma<%1%>(%1%)","numeric overflow");
        in_ST0 = local_d8;
      }
      local_68 = (double)in_ST0;
      local_d8 = (longdouble)CONCAT28(local_d8._8_2_,local_68);
      local_70 = (this->_nd).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[(long)plVar10] + this->_alphaSum;
      boost::math::detail::
      lgamma_imp<long_double,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>,boost::math::lanczos::lanczos17m64>
                ((longdouble *)&local_c9,&local_ca,(longdouble)local_70,
                 (policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                  *)0x0,in_RCX,in_R8);
      lVar15 = in_ST1;
      in_ST0 = in_ST2;
      lVar2 = in_ST3;
      lVar3 = in_ST4;
      lVar4 = in_ST5;
      lVar16 = lVar14;
      lVar17 = lVar14;
      if (local_c8 < ABS(in_ST1)) {
        local_a8 = in_ST1;
        boost::math::policies::detail::raise_error<std::overflow_error,double>
                  ("boost::math::lgamma<%1%>(%1%)","numeric overflow");
        lVar15 = local_a8;
        in_ST0 = in_ST2;
        lVar2 = in_ST3;
        lVar3 = in_ST4;
        lVar4 = in_ST5;
      }
      in_ST5 = lVar16;
      in_ST4 = lVar14;
      in_ST3 = lVar4;
      in_ST2 = lVar3;
      in_ST1 = lVar2;
      local_78 = (double)lVar15;
      local_b0 = local_b0 + (local_d8._0_8_ - local_78);
      if (this->_K == 0) {
        plVar5 = (lanczos17m64 *)0x0;
        plVar11 = plVar10;
      }
      else {
        plVar13 = (lanczos17m64 *)0x0;
        lVar14 = in_ST1;
        lVar15 = in_ST3;
        local_98 = plVar10;
        do {
          in_ST3 = in_ST5;
          in_ST1 = lVar15;
          plVar5 = *(lanczos17m64 **)
                    &(this->_ndk).
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[(long)plVar10].
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data;
          local_80 = *(double *)(plVar5 + (long)plVar13 * 8) +
                     (this->_alpha).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[(long)plVar13];
          boost::math::detail::
          lgamma_imp<long_double,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>,boost::math::lanczos::lanczos17m64>
                    ((longdouble *)&local_b9,(detail *)(local_bb + 1),(longdouble)local_80,
                     (policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                      *)0x0,plVar5,in_R8);
          lVar15 = in_ST2;
          lVar2 = in_ST4;
          in_ST5 = lVar17;
          local_d8 = in_ST0;
          if (local_c8 < ABS(in_ST0)) {
            boost::math::policies::detail::raise_error<std::overflow_error,double>
                      ("boost::math::lgamma<%1%>(%1%)","numeric overflow");
            lVar15 = in_ST2;
            lVar2 = in_ST4;
          }
          in_ST4 = lVar17;
          in_ST2 = lVar2;
          in_ST0 = lVar15;
          local_88 = (double)local_d8;
          local_a8 = (longdouble)CONCAT28(local_a8._8_2_,local_88);
          boost::math::detail::
          lgamma_imp<long_double,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>,boost::math::lanczos::lanczos17m64>
                    ((longdouble *)&local_d9,&local_da,
                     (longdouble)
                     (this->_alpha).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[(long)plVar13],
                     (policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                      *)0x0,plVar5,in_R8);
          lVar17 = in_ST5;
          local_d8 = lVar14;
          if (local_c8 < ABS(lVar14)) {
            boost::math::policies::detail::raise_error<std::overflow_error,double>
                      ("boost::math::lgamma<%1%>(%1%)","numeric overflow");
          }
          local_90 = (double)local_d8;
          local_b0 = local_b0 + (local_a8._0_8_ - local_90);
          plVar13 = plVar13 + 1;
          plVar5 = (lanczos17m64 *)(ulong)this->_K;
          plVar11 = local_98;
          lVar14 = in_ST1;
          lVar15 = in_ST3;
        } while (plVar13 < plVar5);
      }
      plVar10 = plVar11 + 1;
      in_RCX = (lanczos17m64 *)(ulong)this->_D;
    } while (plVar10 < in_RCX);
  }
  pvVar6 = this->_docVoca;
  pvVar7 = (pvVar6->
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((pvVar6->
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish == pvVar7) {
    dVar18 = 0.0;
  }
  else {
    uVar12 = 0;
    dVar18 = 0.0;
    plVar10 = plVar5;
    do {
      puVar8 = pvVar7[uVar12].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (pvVar7[uVar12].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar8) {
        uVar9 = 0;
        do {
          if ((int)plVar10 == 0) {
            plVar10 = (lanczos17m64 *)0x0;
          }
          else {
            uVar1 = puVar8[uVar9];
            plVar10 = (lanczos17m64 *)0x0;
            do {
              __x = *(double *)
                     (*(long *)(*(long *)&(this->_qz).
                                          super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[uVar12].
                                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                          ._M_impl.super__Vector_impl_data + uVar9 * 0x18) +
                     (long)plVar10 * 8);
              if ((__x != 0.0) || (NAN(__x))) {
                local_c8 = (longdouble)CONCAT28(local_c8._8_2_,__x);
                local_d8._0_8_ = dVar18;
                dVar18 = log(__x);
                dVar18 = local_d8._0_8_ +
                         (double)*(uint *)(*(long *)&(this->_frequencyMatrix->
                                                                                                          
                                                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start[uVar12]
                                                  .
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data +
                                          (ulong)uVar1 * 4) * dVar18 * local_c8._0_8_;
                local_d8 = (longdouble)CONCAT28(local_d8._8_2_,dVar18);
                plVar5 = (lanczos17m64 *)(ulong)this->_K;
              }
              plVar10 = plVar10 + 1;
            } while (plVar10 < plVar5);
            pvVar6 = this->_docVoca;
            pvVar7 = (pvVar6->
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            plVar10 = plVar5;
          }
          uVar9 = uVar9 + 1;
          puVar8 = pvVar7[uVar12].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        } while (uVar9 < (ulong)((long)pvVar7[uVar12].
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar8 >>
                                2));
      }
      uVar12 = uVar12 + 1;
      uVar9 = ((long)(pvVar6->
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar7 >> 3) *
              -0x5555555555555555;
    } while (uVar12 <= uVar9 && uVar9 - uVar12 != 0);
  }
  return (local_b8 + local_b0) - dVar18;
}

Assistant:

double VariationalBayesEstimatorOnLDA::calculateVariationalLowerBound()const{//{{{
    double term1=0, term2=0;
    for(int k=0; k<_K; k++){
        term1 += boost::math::lgamma(_betaSum) - boost::math::lgamma(_nk[k]+_betaSum);
        for(int v=0; v<_V; v++){
            try{
                term1 += boost::math::lgamma(_nkv[k][v]+_beta[v]) - boost::math::lgamma(_beta[v]);
            }catch(...){
                term1 += 0;
            }
        }
    }
    for(int d=0; d<_D; d++){
        term2 += boost::math::lgamma(_alphaSum) - boost::math::lgamma(_nd[d]+_alphaSum);
        for(int k=0; k<_K; k++){
        //ndk == 0 -> alphak == 0  lgamma(0) - lgamma(0) = 0
            try{
                term2 += boost::math::lgamma(_ndk[d][k]+_alpha[k]) - boost::math::lgamma(_alpha[k]);
            }catch(...){
                term2 += 0;
            }
        }
    }
    double term3 = 0;
    for(int d=0;d<_docVoca.size();d++){
        for(int l=0; l<_docVoca[d].size(); l++){
            unsigned int v = _docVoca[d][l];
            for(int k=0; k<_K; k++){
                if(_qz[d][l][k] != 0){
                    term3 += _qz[d][l][k] * log(_qz[d][l][k]) * _frequencyMatrix[d][v];
                }
            }
        }
    }
    double variationalLowerBound = term1 + term2 - term3;
    return(variationalLowerBound);
}